

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qp2passes.hpp
# Opt level: O0

QP2PassNodeResult __thiscall mp::QP2PassVisitor::Visit(QP2PassVisitor *this,Expr e,double f)

{
  unkbyte10 Var1;
  Expr e_00;
  QP2PassVisitor *in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  QP2PassNodeResult result;
  longdouble f_save;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 local_4;
  
  if ((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) {
    Var1 = *(unkbyte10 *)(in_RDI + 0x20);
    *(longdouble *)(in_RDI + 0x20) = *(longdouble *)(in_RDI + 0x20) * (longdouble)in_XMM0_Qa;
    e_00.super_ExprBase.impl_._4_4_ = in_stack_ffffffffffffffc4;
    e_00.super_ExprBase.impl_._0_4_ = in_stack_ffffffffffffffc0;
    local_4 = Visit(in_RSI,e_00);
    *(unkbyte10 *)(in_RDI + 0x20) = Var1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

QP2PassNodeResult QP2PassVisitor::Visit(Expr e, double f) {
  if (f) {
    auto f_save = factor_;
    factor_ *= f;
    auto result = Visit(e);
    factor_ = f_save;
    return result;
  }
  return 0;
}